

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.hpp
# Opt level: O2

iterator __thiscall
jsoncons::
order_preserving_json_object<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::vector>
::find(order_preserving_json_object<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::vector>
       *this,string_view_type *name)

{
  basic_string_view<char,_std::char_traits<char>_> __y;
  bool bVar1;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *pkVar2;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  
  pkVar2 = (this->members_).
           super__Vector_base<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  bVar1 = false;
  while ((bVar1 == false &&
         (pkVar2 != (this->members_).
                    super__Vector_base<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish))) {
    __y._M_len = name->_M_len;
    __y._M_str = name->_M_str;
    __x._M_str = (pkVar2->key_)._M_dataplus._M_p;
    __x._M_len = (pkVar2->key_)._M_string_length;
    bVar1 = std::operator==(__x,__y);
    if (!bVar1) {
      pkVar2 = pkVar2 + 1;
    }
  }
  return (iterator)pkVar2;
}

Assistant:

iterator find(const string_view_type& name) noexcept
        {
            bool found = false;
            auto it = members_.begin();
            while (!found && it != members_.end())
            {
                if ((*it).key() == name)
                {
                    found = true;
                }
                else
                {
                    ++it;
                }
            }
            return it;
        }